

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backtrace-alloc.cc
# Opt level: O3

void resize_to(backtrace_state *state,size_t new_size,backtrace_vector *vec)

{
  void *__dest;
  void *in_RCX;
  
  __dest = tcmalloc_backtrace_alloc(state,new_size,(backtrace_error_callback)vec,in_RCX);
  memcpy(__dest,vec->base,vec->size);
  if (vec->base != (void *)0x0) {
    tcmalloc::LowLevelAlloc::Free(vec->base);
  }
  vec->base = __dest;
  vec->alc = new_size - vec->size;
  return;
}

Assistant:

static void resize_to(struct backtrace_state *state,
                      size_t new_size,
                      struct backtrace_vector *vec) {
  void *base = tcmalloc_backtrace_alloc(state, new_size, nullptr, nullptr);
  memcpy(base, vec->base, vec->size);
  tcmalloc_backtrace_free(state, vec->base, vec->alc, nullptr, nullptr);

  vec->base = base;
  vec->alc = new_size - vec->size;
}